

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemerror.cpp
# Opt level: O2

QString * QSystemError::string(QString *__return_storage_ptr__,ErrorScope errorScope,int errorCode)

{
  if (errorScope - StandardLibraryError < 2) {
    standardLibraryErrorString(__return_storage_ptr__,errorCode);
  }
  else {
    Qt::Literals::StringLiterals::operator____s(__return_storage_ptr__,L"No error",8);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QSystemError::string(ErrorScope errorScope, int errorCode)
{
    switch (errorScope) {
    case NativeError:
#if defined(Q_OS_WIN)
        return windowsErrorString(errorCode);
#endif // else unix: native and standard library are the same
    case StandardLibraryError:
        return standardLibraryErrorString(errorCode);
    default:
        qWarning("invalid error scope");
        Q_FALLTHROUGH();
    case NoError:
        return u"No error"_s;
    }
}